

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void duckdb::QuantileOperation::
     ConstantOperation<double,duckdb::QuantileState<double,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,true>>
               (QuantileState<double,_duckdb::QuantileStandardType> *state,double *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  iterator __position;
  double local_28;
  
  if (count != 0) {
    do {
      local_28 = *input;
      __position._M_current =
           (state->v).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (state->v).super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)state,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        (state->v).super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}